

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O3

TestTextureCubeSp __thiscall
vkt::texture::util::loadTextureCube
          (util *this,Archive *archive,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames)

{
  pointer pbVar1;
  pointer pcVar2;
  long *plVar3;
  undefined4 size;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  int iVar5;
  TestTextureCube *pTVar6;
  long *plVar7;
  int *piVar8;
  TestError *pTVar9;
  uint uVar10;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  SharedPtrStateBase *extraout_RDX_01;
  SharedPtrStateBase *extraout_RDX_02;
  SharedPtrStateBase *pSVar11;
  SharedPtrStateBase *extraout_RDX_03;
  long lVar12;
  pointer_____offset_0x10___ *ppuVar13;
  long *plVar14;
  ulong uVar15;
  TestTextureCubeSp TVar16;
  CompressedTexture level;
  TextureFormat commonFormat;
  TextureFormat uncompressedFormat;
  vector<unsigned_char,_std::allocator<unsigned_char>_> commonFromatData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressedData;
  string ext;
  PixelBufferAccess decompressedBuffer;
  PixelBufferAccess commonFormatBuffer;
  undefined1 local_148 [40];
  TextureFormat local_120;
  Archive *local_118;
  TextureFormat local_110;
  TestTextureCube *local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  string local_c8;
  PixelBufferAccess local_a8;
  PixelBufferAccess local_80;
  TexDecompressionParams local_58 [10];
  
  pbVar1 = (filenames->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (int)((ulong)((long)(filenames->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) >> 5) *
           -0x55555555 + 0x2aaaaaaa;
  local_118 = archive;
  if (0x2aaaaaaa < (uVar10 >> 1 | (uint)((uVar10 & 1) != 0) << 0x1f)) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,(char *)0x0,"(int)filenames.size() % tcu::CUBEFACE_LAST == 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
               ,0x6a9);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  local_148._0_8_ = (long)local_148 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_148,pcVar2,pcVar2 + pbVar1->_M_string_length);
  de::FilePath::getFileExtension_abi_cxx11_(&local_c8,(FilePath *)local_148);
  if (local_148._0_8_ != (long)local_148 + 0x10) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_c8);
  if (iVar5 == 0) {
    pSVar11 = extraout_RDX;
    if ((filenames->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (filenames->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      lVar12 = 0;
      plVar14 = (long *)0x0;
      uVar15 = 0;
      do {
        tcu::TextureLevel::TextureLevel((TextureLevel *)local_148);
        tcu::ImageIO::loadImage
                  ((TextureLevel *)local_148,local_118,
                   *(char **)((long)&(((filenames->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                     _M_p + lVar12));
        size = local_148._8_4_;
        if ((SUB84(local_148._0_8_,4) != UNORM_INT8) || (1 < (ChannelOrder)local_148._0_8_ - RGB)) {
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::InternalError::InternalError
                    ((InternalError *)pTVar9,(char *)0x0,
                     "level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8) || level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                     ,0x6b9);
          ppuVar13 = &tcu::InternalError::typeinfo;
LAB_0082bc76:
          __cxa_throw(pTVar9,ppuVar13,tcu::Exception::~Exception);
        }
        if (local_148._8_4_ != local_148._12_4_) {
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,(char *)0x0,"level.getWidth() == level.getHeight()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                     ,0x6bb);
          ppuVar13 = &tcu::TestError::typeinfo;
          goto LAB_0082bc76;
        }
        if (uVar15 == 0) {
          pTVar6 = (TestTextureCube *)operator_new(0x188);
          local_a8.super_ConstPixelBufferAccess.m_format.order = RGBA;
          local_a8.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
          pipeline::TestTextureCube::TestTextureCube(pTVar6,(TextureFormat *)&local_a8,size);
          plVar7 = (long *)operator_new(0x20);
          *(undefined4 *)(plVar7 + 1) = 0;
          *(undefined4 *)((long)plVar7 + 0xc) = 0;
          *plVar7 = (long)&PTR__SharedPtrState_00d386a0;
          plVar7[2] = (long)pTVar6;
          *(undefined4 *)(plVar7 + 1) = 1;
          *(undefined4 *)((long)plVar7 + 0xc) = 1;
          plVar14 = *(long **)(this + 8);
          if (plVar14 != plVar7) {
            local_108 = pTVar6;
            if (plVar14 != (long *)0x0) {
              LOCK();
              plVar14 = plVar14 + 1;
              *(int *)plVar14 = (int)*plVar14 + -1;
              UNLOCK();
              plVar3 = *(long **)(this + 8);
              if ((int)*plVar14 == 0) {
                *(undefined8 *)this = 0;
                (**(code **)(*plVar3 + 0x10))(plVar3);
              }
              LOCK();
              piVar8 = (int *)((long)plVar3 + 0xc);
              *piVar8 = *piVar8 + -1;
              UNLOCK();
              if ((*piVar8 == 0) && (*(long **)(this + 8) != (long *)0x0)) {
                (**(code **)(**(long **)(this + 8) + 8))();
              }
            }
            *(TestTextureCube **)this = local_108;
            *(long **)(this + 8) = plVar7;
            LOCK();
            *(int *)(plVar7 + 1) = (int)plVar7[1] + 1;
            UNLOCK();
            LOCK();
            *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
            UNLOCK();
          }
          plVar14 = plVar7 + 1;
          LOCK();
          *(int *)plVar14 = (int)*plVar14 + -1;
          UNLOCK();
          if ((int)*plVar14 == 0) {
            (**(code **)(*plVar7 + 0x10))(plVar7);
          }
          piVar8 = (int *)((long)plVar7 + 0xc);
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            (**(code **)(*plVar7 + 8))(plVar7);
          }
          plVar14 = *(long **)this;
        }
        (**(code **)(*plVar14 + 0x38))(&local_a8,plVar14,(int)uVar15 / 6,(int)uVar15 % 6);
        tcu::TextureLevel::getAccess(&local_80,(TextureLevel *)local_148);
        tcu::copy((EVP_PKEY_CTX *)&local_a8,(EVP_PKEY_CTX *)&local_80);
        tcu::TextureLevel::~TextureLevel((TextureLevel *)local_148);
        uVar15 = uVar15 + 1;
        lVar12 = lVar12 + 0x20;
        pSVar11 = extraout_RDX_02;
      } while (uVar15 < (ulong)((long)(filenames->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(filenames->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5));
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_c8);
    if (iVar5 != 0) {
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"Unsupported file format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                 ,0x6e0);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pSVar11 = extraout_RDX_00;
    if ((filenames->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (filenames->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      lVar12 = 0;
      uVar15 = 0;
      local_100 = filenames;
      do {
        pvVar4 = local_100;
        tcu::CompressedTexture::CompressedTexture((CompressedTexture *)local_148);
        tcu::ImageIO::loadPKM
                  ((CompressedTexture *)local_148,local_118,
                   *(char **)((long)&(((pvVar4->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                     _M_p + lVar12));
        if (local_148._4_4_ != local_148._8_4_) {
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,(char *)0x0,"level.getWidth() == level.getHeight()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                     ,0x6cc);
          __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        local_110 = tcu::getUncompressedFormat(local_148._0_4_);
        iVar5 = tcu::TextureFormat::getPixelSize(&local_110);
        local_a8.super_ConstPixelBufferAccess.m_format =
             (TextureFormat)
             ((ulong)local_a8.super_ConstPixelBufferAccess.m_format & 0xffffffffffffff00);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_e0,(long)(iVar5 * local_148._4_4_ * local_148._8_4_),
                   (value_type_conflict5 *)&local_a8,(allocator_type *)&local_80);
        tcu::PixelBufferAccess::PixelBufferAccess
                  (&local_a8,&local_110,local_148._4_4_,local_148._8_4_,1,
                   local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        local_120.order = RGBA;
        local_120.type = UNORM_INT8;
        iVar5 = tcu::TextureFormat::getPixelSize(&local_120);
        local_80.super_ConstPixelBufferAccess.m_format.order._0_1_ = (allocator_type)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_f8,(long)(iVar5 * local_148._4_4_ * local_148._8_4_),
                   (value_type_conflict5 *)&local_80,(allocator_type *)local_58);
        tcu::PixelBufferAccess::PixelBufferAccess
                  (&local_80,&local_120,local_148._4_4_,local_148._8_4_,1,
                   local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        if (uVar15 == 0) {
          pTVar6 = (TestTextureCube *)operator_new(0x188);
          pipeline::TestTextureCube::TestTextureCube(pTVar6,&local_120,local_148._4_4_);
          plVar7 = (long *)operator_new(0x20);
          *(undefined4 *)(plVar7 + 1) = 0;
          *(undefined4 *)((long)plVar7 + 0xc) = 0;
          *plVar7 = (long)&PTR__SharedPtrState_00d386a0;
          plVar7[2] = (long)pTVar6;
          *(undefined4 *)(plVar7 + 1) = 1;
          *(undefined4 *)((long)plVar7 + 0xc) = 1;
          plVar14 = *(long **)(this + 8);
          if (plVar14 != plVar7) {
            if (plVar14 != (long *)0x0) {
              LOCK();
              plVar14 = plVar14 + 1;
              *(int *)plVar14 = (int)*plVar14 + -1;
              UNLOCK();
              plVar3 = *(long **)(this + 8);
              if ((int)*plVar14 == 0) {
                *(undefined8 *)this = 0;
                (**(code **)(*plVar3 + 0x10))(plVar3);
              }
              LOCK();
              piVar8 = (int *)((long)plVar3 + 0xc);
              *piVar8 = *piVar8 + -1;
              UNLOCK();
              if ((*piVar8 == 0) && (*(long **)(this + 8) != (long *)0x0)) {
                (**(code **)(**(long **)(this + 8) + 8))();
              }
            }
            *(TestTextureCube **)this = pTVar6;
            *(long **)(this + 8) = plVar7;
            LOCK();
            *(int *)(plVar7 + 1) = (int)plVar7[1] + 1;
            UNLOCK();
            LOCK();
            *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
            UNLOCK();
          }
          plVar14 = plVar7 + 1;
          LOCK();
          *(int *)plVar14 = (int)*plVar14 + -1;
          UNLOCK();
          if ((int)*plVar14 == 0) {
            (**(code **)(*plVar7 + 0x10))(plVar7);
          }
          piVar8 = (int *)((long)plVar7 + 0xc);
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            (**(code **)(*plVar7 + 8))(plVar7);
          }
        }
        local_58[0].astcMode = ASTCMODE_LDR;
        tcu::CompressedTexture::decompress((CompressedTexture *)local_148,&local_a8,local_58);
        tcu::copy((EVP_PKEY_CTX *)&local_80,(EVP_PKEY_CTX *)&local_a8);
        (**(code **)(**(long **)this + 0x38))
                  ((EVP_PKEY_CTX *)local_58,*(long **)this,(int)uVar15 / 6,(int)uVar15 % 6);
        tcu::copy((EVP_PKEY_CTX *)local_58,(EVP_PKEY_CTX *)&local_80);
        if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_f8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_f8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        tcu::CompressedTexture::~CompressedTexture((CompressedTexture *)local_148);
        uVar15 = uVar15 + 1;
        lVar12 = lVar12 + 0x20;
        pSVar11 = extraout_RDX_01;
      } while (uVar15 < (ulong)((long)(local_100->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_100->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    pSVar11 = extraout_RDX_03;
  }
  TVar16.m_state = pSVar11;
  TVar16.m_ptr = (TestTextureCube *)this;
  return TVar16;
}

Assistant:

TestTextureCubeSp loadTextureCube (const tcu::Archive& archive, const std::vector<std::string>& filenames)
{
	DE_ASSERT(filenames.size() > 0);
	DE_STATIC_ASSERT(tcu::CUBEFACE_LAST == 6);
	TCU_CHECK((int)filenames.size() % tcu::CUBEFACE_LAST == 0);

	TestTextureCubeSp texture;

	std::string ext = de::FilePath(filenames[0]).getFileExtension();

	if (ext == "png")
	{

		for (size_t fileIndex = 0; fileIndex < filenames.size(); ++fileIndex)
		{
			tcu::TextureLevel level;

			tcu::ImageIO::loadImage(level, archive, filenames[fileIndex].c_str());

			TCU_CHECK_INTERNAL(level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8) ||
											   level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8));

			TCU_CHECK( level.getWidth() == level.getHeight());

			if (fileIndex == 0)
				texture = TestTextureCubeSp(new pipeline::TestTextureCube(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), level.getWidth()));

			tcu::copy(texture->getLevel((int)fileIndex / 6, (int)fileIndex % 6), level.getAccess());
		}
	}
	else if (ext == "pkm")
	{
		for (size_t fileIndex = 0; fileIndex < filenames.size(); ++fileIndex)
		{
			// Compressed texture.
			tcu::CompressedTexture	level;

			tcu::ImageIO::loadPKM(level, archive, filenames[fileIndex].c_str());

			TCU_CHECK( level.getWidth() == level.getHeight());

			tcu::TextureFormat		uncompressedFormat				= tcu::getUncompressedFormat(level.getFormat());
			std::vector<deUint8>	uncompressedData				(uncompressedFormat.getPixelSize() * level.getWidth() * level.getHeight(), 0);
			tcu::PixelBufferAccess	decompressedBuffer				(uncompressedFormat, level.getWidth(), level.getHeight(), 1, uncompressedData.data());

			tcu::TextureFormat		commonFormat					= tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8);
			std::vector<deUint8>	commonFromatData				(commonFormat.getPixelSize() * level.getWidth() * level.getHeight(), 0);
			tcu::PixelBufferAccess	commonFormatBuffer				(commonFormat, level.getWidth(), level.getHeight(), 1, commonFromatData.data());

			if (fileIndex == 0)
				texture = TestTextureCubeSp(new pipeline::TestTextureCube(commonFormat, level.getWidth()));

			level.decompress(decompressedBuffer, tcu::TexDecompressionParams(tcu::TexDecompressionParams::ASTCMODE_LDR));

			tcu::copy(commonFormatBuffer, decompressedBuffer);
			tcu::copy(texture->getLevel((int)fileIndex / 6, (int)fileIndex % 6), commonFormatBuffer);
		}
	}
	else
		TCU_FAIL("Unsupported file format");

	return texture;
}